

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void EnumStr(node *p,array *List)

{
  dataid *pdVar1;
  size_t StrSize;
  dataid *i;
  dataid Id;
  array *List_local;
  node *p_local;
  
  if (p == (node *)0x0) {
    __assert_fail("(const void*)(p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                  ,0x474,"void EnumStr(node *, array *)");
  }
  pdVar1 = (dataid *)StrTab_Size((strtab *)(*p->VMT + 0x130));
  List->_Begin = (char *)0x0;
  List->_Used = 0;
  ArrayResize(List,(long)pdVar1 << 3,0);
  if (List != (array *)0x0) {
    StrSize = (size_t)List->_Begin;
    for (i = (dataid *)0x0; i < pdVar1; i = (dataid *)((long)i + 1)) {
      *(dataid **)StrSize = i + 0x20;
      StrSize = StrSize + 8;
    }
    return;
  }
  __assert_fail("&(*List)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x478,"void EnumStr(node *, array *)");
}

Assistant:

static void EnumStr(node *p,array* List)
{
    dataid Id,*i;
    size_t StrSize = StrTab_Size(&Parser_Context(p)->StrTab);

    ArrayInit(List);
    ArrayResize(List,StrSize*sizeof(dataid),0);
    i = ARRAYBEGIN(*List,dataid);
    for (Id = 0;Id < StrSize;++Id,++i)
        *i = Id+LANG_STRINGS_OFFSET;
}